

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O0

string_view translateCharacter(string_view object)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  basic_string_view<char,_std::char_traits<char>_> __x_19;
  basic_string_view<char,_std::char_traits<char>_> __x_20;
  basic_string_view<char,_std::char_traits<char>_> __x_21;
  basic_string_view<char,_std::char_traits<char>_> __x_22;
  basic_string_view<char,_std::char_traits<char>_> __x_23;
  basic_string_view<char,_std::char_traits<char>_> __x_24;
  basic_string_view<char,_std::char_traits<char>_> __x_25;
  basic_string_view<char,_std::char_traits<char>_> __x_26;
  string_view sVar1;
  undefined1 auVar2 [8];
  size_t sVar3;
  bool bVar4;
  size_type sVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  undefined1 local_28 [8];
  string_view object_local;
  char *local_10;
  
  object_local._M_len = (size_t)object._M_str;
  local_28 = (undefined1  [8])object._M_len;
  bVar6 = sv("GDI_",4);
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_28,bVar6,0);
  if (sVar5 == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)local_28,4);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    bVar6 = sv("Deadeye",7);
    __x_26._M_str = (char *)sVar3;
    __x_26._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_26,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)7;
      local_10 = "Deadeye";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("Engineer",8);
    __x_25._M_str = (char *)sVar3;
    __x_25._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_25,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)0xc;
      local_10 = "GDI Engineer";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("Grenadier",9);
    __x_24._M_str = (char *)sVar3;
    __x_24._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_24,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)9;
      local_10 = "Grenadier";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("Gunner",6);
    __x_23._M_str = (char *)sVar3;
    __x_23._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_23,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)6;
      local_10 = "Gunner";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("Havoc",5);
    __x_22._M_str = (char *)sVar3;
    __x_22._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_22,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)5;
      local_10 = "Havoc";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("Hotwire",7);
    __x_21._M_str = (char *)sVar3;
    __x_21._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_21,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)7;
      local_10 = "Hotwire";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("Marksman",8);
    __x_20._M_str = (char *)sVar3;
    __x_20._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_20,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)0xc;
      local_10 = "GDI Marksman";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("McFarland",9);
    __x_19._M_str = (char *)sVar3;
    __x_19._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_19,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)9;
      local_10 = "McFarland";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("Mobius",6);
    __x_18._M_str = (char *)sVar3;
    __x_18._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_18,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)6;
      local_10 = "Mobius";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("Officer",7);
    __x_17._M_str = (char *)sVar3;
    __x_17._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_17,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)0xb;
      local_10 = "GDI Officer";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("Patch",5);
    __x_16._M_str = (char *)sVar3;
    __x_16._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_16,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)5;
      local_10 = "Patch";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("RocketSoldier",0xd);
    __x_15._M_str = (char *)sVar3;
    __x_15._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_15,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)0x12;
      local_10 = "GDI Rocket Soldier";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("Shotgunner",10);
    __x_14._M_str = (char *)sVar3;
    __x_14._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_14,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)0xe;
      local_10 = "GDI Shotgunner";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("Soldier",7);
    __x_13._M_str = (char *)sVar3;
    __x_13._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_13,bVar6);
    sVar3 = object_local._M_len;
    auVar2 = local_28;
    if (bVar4) {
      object_local._M_str = (char *)0xb;
      local_10 = "GDI Soldier";
      goto LAB_0017dfa7;
    }
    bVar6 = sv("Sydney",6);
    __x_12._M_str = (char *)sVar3;
    __x_12._M_len = (size_t)auVar2;
    bVar4 = std::operator==(__x_12,bVar6);
    if (bVar4) {
      object_local._M_str = (char *)6;
      local_10 = "Sydney";
      goto LAB_0017dfa7;
    }
  }
  else {
    bVar6 = sv("Nod_",4);
    sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_28,bVar6,0);
    if (sVar5 == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                ((basic_string_view<char,_std::char_traits<char>_> *)local_28,4);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      bVar7 = sv("BlackHandSniper",0xf);
      bVar6._M_str = (char *)sVar3;
      bVar6._M_len = (size_t)auVar2;
      bVar4 = std::operator==(bVar6,bVar7);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)0x11;
        local_10 = "Black Hand Sniper";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("ChemicalTrooper",0xf);
      bVar7._M_str = (char *)sVar3;
      bVar7._M_len = (size_t)auVar2;
      bVar4 = std::operator==(bVar7,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)0x10;
        local_10 = "Chemical Trooper";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("Engineer",8);
      __x_11._M_str = (char *)sVar3;
      __x_11._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x_11,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)0xc;
        local_10 = "Nod Engineer";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("FlameTrooper",0xc);
      __x_10._M_str = (char *)sVar3;
      __x_10._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x_10,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)0xd;
        local_10 = "Flame Trooper";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("LaserChainGunner",0x10);
      __x_09._M_str = (char *)sVar3;
      __x_09._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x_09,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)0x12;
        local_10 = "Laser Chain Gunner";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("Marksman",8);
      __x_08._M_str = (char *)sVar3;
      __x_08._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x_08,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)0xc;
        local_10 = "Nod Marksman";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("Mendoza",7);
      __x_07._M_str = (char *)sVar3;
      __x_07._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x_07,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)7;
        local_10 = "Mendoza";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("Officer",7);
      __x_06._M_str = (char *)sVar3;
      __x_06._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x_06,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)0xb;
        local_10 = "Nod Officer";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("Raveshaw",8);
      __x_05._M_str = (char *)sVar3;
      __x_05._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x_05,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)8;
        local_10 = "Raveshaw";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("RocketSoldier",0xd);
      __x_04._M_str = (char *)sVar3;
      __x_04._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x_04,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)0x12;
        local_10 = "Nod Rocket Soldier";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("Sakura",6);
      __x_03._M_str = (char *)sVar3;
      __x_03._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x_03,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)6;
        local_10 = "Sakura";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("Shotgunner",10);
      __x_02._M_str = (char *)sVar3;
      __x_02._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x_02,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)0xe;
        local_10 = "Nod Shotgunner";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("Soldier",7);
      __x_01._M_str = (char *)sVar3;
      __x_01._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x_01,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)0xb;
        local_10 = "Nod Soldier";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("StealthBlackHand",0x10);
      __x_00._M_str = (char *)sVar3;
      __x_00._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x_00,bVar6);
      sVar3 = object_local._M_len;
      auVar2 = local_28;
      if (bVar4) {
        object_local._M_str = (char *)0x12;
        local_10 = "Stealth Black Hand";
        goto LAB_0017dfa7;
      }
      bVar6 = sv("Technician",10);
      __x._M_str = (char *)sVar3;
      __x._M_len = (size_t)auVar2;
      bVar4 = std::operator==(__x,bVar6);
      if (bVar4) {
        object_local._M_str = (char *)10;
        local_10 = "Technician";
        goto LAB_0017dfa7;
      }
    }
  }
  object_local._M_str = (char *)local_28;
  local_10 = (char *)object_local._M_len;
LAB_0017dfa7:
  sVar1._M_str = local_10;
  sVar1._M_len = (size_t)object_local._M_str;
  return sVar1;
}

Assistant:

std::string_view translateCharacter(std::string_view object)
{
	if (object.find("GDI_"sv) == 0)
	{
		object.remove_prefix(4);
		if (object == "Deadeye"sv) return translated_GDI_Deadeye;
		if (object == "Engineer"sv) return translated_GDI_Engineer;
		if (object == "Grenadier"sv) return translated_GDI_Grenadier;
		if (object == "Gunner"sv) return translated_GDI_Gunner;
		if (object == "Havoc"sv) return translated_GDI_Havoc;
		if (object == "Hotwire"sv) return translated_GDI_Hotwire;
		if (object == "Marksman"sv) return translated_GDI_Marksman;
		if (object == "McFarland"sv) return translated_GDI_McFarland;
		if (object == "Mobius"sv) return translated_GDI_Mobius;
		if (object == "Officer"sv) return translated_GDI_Officer;
		if (object == "Patch"sv) return translated_GDI_Patch;
		if (object == "RocketSoldier"sv) return translated_GDI_RocketSoldier;
		if (object == "Shotgunner"sv) return translated_GDI_Shotgunner;
		if (object == "Soldier"sv) return translated_GDI_Soldier;
		if (object == "Sydney"sv) return translated_GDI_Sydney;
	}
	else if (object.find("Nod_"sv) == 0)
	{
		object.remove_prefix(4);
		if (object == "BlackHandSniper"sv) return translated_Nod_BlackHandSniper;
		if (object == "ChemicalTrooper"sv) return translated_Nod_ChemicalTrooper;
		if (object == "Engineer"sv) return translated_Nod_Engineer;
		if (object == "FlameTrooper"sv) return translated_Nod_FlameTrooper;
		if (object == "LaserChainGunner"sv) return translated_Nod_LaserChainGunner;
		if (object == "Marksman"sv) return translated_Nod_Marksman;
		if (object == "Mendoza"sv) return translated_Nod_Mendoza;
		if (object == "Officer"sv) return translated_Nod_Officer;
		if (object == "Raveshaw"sv) return translated_Nod_Raveshaw;
		if (object == "RocketSoldier"sv) return translated_Nod_RocketSoldier;
		if (object == "Sakura"sv) return translated_Nod_Sakura;
		if (object == "Shotgunner"sv) return translated_Nod_Shotgunner;
		if (object == "Soldier"sv) return translated_Nod_Soldier;
		if (object == "StealthBlackHand"sv) return translated_Nod_StealthBlackHand;
		if (object == "Technician"sv) return translated_Nod_Technician;
	}

	return object;
}